

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyLocals.cpp
# Opt level: O2

void __thiscall
wasm::SimplifyLocals<true,_false,_true>::~SimplifyLocals(SimplifyLocals<true,_false,_true> *this)

{
  (this->
  super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>_>
  ).super_Pass._vptr_Pass = (_func_int **)&PTR__SimplifyLocals_00e21448;
  std::_Vector_base<wasm::Loop_*,_std::allocator<wasm::Loop_*>_>::~_Vector_base
            (&(this->loopsToEnlarge).super__Vector_base<wasm::Loop_*,_std::allocator<wasm::Loop_*>_>
            );
  std::_Vector_base<wasm::If_*,_std::allocator<wasm::If_*>_>::~_Vector_base
            (&(this->ifsToEnlarge).super__Vector_base<wasm::If_*,_std::allocator<wasm::If_*>_>);
  std::_Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>::~_Vector_base
            (&(this->blocksToEnlarge).
              super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>);
  std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
            (&(this->expressionStack).flexible.
              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>);
  LocalGetCounter::~LocalGetCounter(&this->getCounter);
  std::
  vector<std::map<unsigned_int,_wasm::SimplifyLocals<true,_false,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_false,_true>::SinkableInfo>_>_>,_std::allocator<std::map<unsigned_int,_wasm::SimplifyLocals<true,_false,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_false,_true>::SinkableInfo>_>_>_>_>
  ::~vector(&this->ifStack);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree(&(this->unoptimizableBlocks)._M_t);
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::vector<wasm::SimplifyLocals<true,_false,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_false,_true>::BlockBreak>_>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::vector<wasm::SimplifyLocals<true,_false,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_false,_true>::BlockBreak>_>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::SimplifyLocals<true,_false,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<true,_false,_true>::BlockBreak>_>_>_>_>
  ::~_Rb_tree(&(this->blockBreaks)._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_false,_true>::SinkableInfo>,_std::_Select1st<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_false,_true>::SinkableInfo>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_false,_true>::SinkableInfo>_>_>
  ::~_Rb_tree(&(this->sinkables)._M_t);
  WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>_>
  ::~WalkerPass(&this->
                 super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<true,_false,_true>,_wasm::Visitor<wasm::SimplifyLocals<true,_false,_true>,_void>_>_>
               );
  return;
}

Assistant:

bool isFunctionParallel() override { return true; }